

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::priceByColumn
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          HighsInt debug_report)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::priceByColumn:");
  }
  result->count = 0;
  piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar8 = 0; lVar8 < this->num_col_; lVar8 = lVar8 + 1) {
    lVar9 = (long)piVar2[lVar8];
    lVar10 = (long)piVar2[lVar8 + 1];
    piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = 0.0;
    if (quad_precision) {
      dVar12 = 0.0;
      for (; lVar9 < lVar10; lVar9 = lVar9 + 1) {
        dVar13 = pdVar7[piVar5[lVar9]] * pdVar6[lVar9];
        dVar14 = dVar12 + dVar13;
        dVar11 = dVar11 + (dVar12 - (dVar14 - dVar13)) + (dVar13 - (dVar14 - (dVar14 - dVar13)));
        dVar12 = dVar14;
      }
      dVar11 = dVar11 + dVar12;
    }
    else {
      for (; lVar9 < lVar10; lVar9 = lVar9 + 1) {
        dVar11 = dVar11 + pdVar7[piVar5[lVar9]] * pdVar6[lVar9];
      }
    }
    if (1e-14 < ABS(dVar11)) {
      pdVar4[lVar8] = dVar11;
      iVar1 = result->count;
      result->count = iVar1 + 1;
      piVar3[iVar1] = (int)lVar8;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByColumn(const bool quad_precision,
                                      HVector& result, const HVector& column,
                                      const HighsInt debug_report) const {
  assert(this->isColwise());
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByColumn:\n");
  result.count = 0;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    double value = 0;
    if (quad_precision) {
      HighsCDouble quad_value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        quad_value += column.array[this->index_[iEl]] * this->value_[iEl];
      value = (double)quad_value;
    } else {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];
    }
    if (fabs(value) > kHighsTiny) {
      result.array[iCol] = value;
      result.index[result.count++] = iCol;
    }
  }
}